

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O2

void __thiscall
spvtools::opt::RegisterLiveness::ComputeLoopRegisterPressure
          (RegisterLiveness *this,Loop *loop,RegionRegisterLiveness *loop_reg_pressure)

{
  _Hash_node_base _Var1;
  Instruction *insn_00;
  RegisterLiveness *this_00;
  bool bVar2;
  RegionRegisterLiveness *pRVar3;
  size_type sVar4;
  CFG *this_01;
  BasicBlock *pBVar5;
  ulong uVar6;
  LiveSet *__range2;
  __node_base *p_Var7;
  __node_base _Var8;
  __node_base *p_Var9;
  Instruction *insn;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_insn;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_blocks;
  uint32_t local_ac;
  RegisterLiveness *local_a8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  RegionRegisterLiveness::Clear(loop_reg_pressure);
  pRVar3 = Get(this,loop->loop_header_);
  std::
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::operator=((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)loop_reg_pressure,
              (_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)pRVar3);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  Loop::GetExitBlocks(loop,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&local_68);
  for (_Var8._M_nxt = local_68._M_before_begin._M_nxt; _Var8._M_nxt != (_Hash_node_base *)0x0;
      _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt) {
    pRVar3 = Get(this,*(uint32_t *)&_Var8._M_nxt[1]._M_nxt);
    std::__detail::
    _Insert_base<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::insert<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>>
              ((_Insert_base<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&loop_reg_pressure->live_out_,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>)
               (pRVar3->live_in_)._M_h._M_before_begin._M_nxt,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>)0x0);
  }
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  p_Var7 = &(loop_reg_pressure->live_out_)._M_h._M_before_begin;
  local_a8 = this;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    _Var1._M_nxt = p_Var7[1]._M_nxt;
    RegionRegisterLiveness::AddRegisterClass(loop_reg_pressure,(Instruction *)_Var1._M_nxt);
    local_ac = Instruction::result_id((Instruction *)_Var1._M_nxt);
    std::__detail::
    _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&local_a0,&local_ac);
  }
  p_Var7 = &(loop_reg_pressure->live_in_)._M_h._M_before_begin;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    _Var1._M_nxt = p_Var7[1]._M_nxt;
    local_ac = Instruction::result_id((Instruction *)_Var1._M_nxt);
    sVar4 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&local_a0,&local_ac);
    if (sVar4 != 0) {
      RegionRegisterLiveness::AddRegisterClass(loop_reg_pressure,(Instruction *)_Var1._M_nxt);
      local_ac = Instruction::result_id((Instruction *)_Var1._M_nxt);
      std::__detail::
      _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&local_a0,&local_ac);
    }
  }
  loop_reg_pressure->used_registers_ = 0;
  p_Var9 = &(loop->loop_basic_blocks_)._M_h._M_before_begin;
  while( true ) {
    this_00 = local_a8;
    p_Var9 = p_Var9->_M_nxt;
    if (p_Var9 == (__node_base *)0x0) {
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_a0);
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_68);
      return;
    }
    sVar4 = *(size_type *)(p_Var9 + 1);
    this_01 = IRContext::cfg(local_a8->context_);
    pBVar5 = CFG::block(this_01,(uint32_t)sVar4);
    pRVar3 = Get(this_00,(uint32_t)sVar4);
    if (pRVar3 == (RegionRegisterLiveness *)0x0) break;
    uVar6 = pRVar3->used_registers_;
    if (pRVar3->used_registers_ < loop_reg_pressure->used_registers_) {
      uVar6 = loop_reg_pressure->used_registers_;
    }
    loop_reg_pressure->used_registers_ = uVar6;
    insn_00 = &(pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    while (insn_00 = *(Instruction **)
                      ((long)&insn_00->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8),
          insn_00 != &(pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
      if ((insn_00->opcode_ != OpPhi) &&
         (bVar2 = anon_unknown_8::CreatesRegisterUsage(insn_00), bVar2)) {
        local_ac = Instruction::result_id(insn_00);
        sVar4 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&local_a0,&local_ac);
        if (sVar4 == 0) {
          RegionRegisterLiveness::AddRegisterClass(loop_reg_pressure,insn_00);
        }
      }
    }
  }
  __assert_fail("live_inout != nullptr && \"Basic block not processed\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp"
                ,0x142,
                "void spvtools::opt::RegisterLiveness::ComputeLoopRegisterPressure(const Loop &, RegionRegisterLiveness *) const"
               );
}

Assistant:

void RegisterLiveness::ComputeLoopRegisterPressure(
    const Loop& loop, RegionRegisterLiveness* loop_reg_pressure) const {
  loop_reg_pressure->Clear();

  const RegionRegisterLiveness* header_live_inout = Get(loop.GetHeaderBlock());
  loop_reg_pressure->live_in_ = header_live_inout->live_in_;

  std::unordered_set<uint32_t> exit_blocks;
  loop.GetExitBlocks(&exit_blocks);

  for (uint32_t bb_id : exit_blocks) {
    const RegionRegisterLiveness* live_inout = Get(bb_id);
    loop_reg_pressure->live_out_.insert(live_inout->live_in_.begin(),
                                        live_inout->live_in_.end());
  }

  std::unordered_set<uint32_t> seen_insn;
  for (Instruction* insn : loop_reg_pressure->live_out_) {
    loop_reg_pressure->AddRegisterClass(insn);
    seen_insn.insert(insn->result_id());
  }
  for (Instruction* insn : loop_reg_pressure->live_in_) {
    if (!seen_insn.count(insn->result_id())) {
      continue;
    }
    loop_reg_pressure->AddRegisterClass(insn);
    seen_insn.insert(insn->result_id());
  }

  loop_reg_pressure->used_registers_ = 0;

  for (uint32_t bb_id : loop.GetBlocks()) {
    BasicBlock* bb = context_->cfg()->block(bb_id);

    const RegionRegisterLiveness* live_inout = Get(bb_id);
    assert(live_inout != nullptr && "Basic block not processed");
    loop_reg_pressure->used_registers_ = std::max(
        loop_reg_pressure->used_registers_, live_inout->used_registers_);

    for (Instruction& insn : *bb) {
      if (insn.opcode() == spv::Op::OpPhi || !CreatesRegisterUsage(&insn) ||
          seen_insn.count(insn.result_id())) {
        continue;
      }
      loop_reg_pressure->AddRegisterClass(&insn);
    }
  }
}